

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vli_size.c
# Opt level: O3

uint32_t lzma_vli_size(lzma_vli vli)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  if ((long)vli < 0) {
    return 0;
  }
  uVar3 = 0xffffffff;
  do {
    uVar2 = uVar3;
    uVar3 = uVar2 + 1;
    bVar1 = 0x7f < vli;
    vli = vli >> 7;
  } while (bVar1);
  if (uVar3 < 9) {
    return uVar2 + 2;
  }
  __assert_fail("i <= LZMA_VLI_BYTES_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/vli_size.c"
                ,0x1c,"uint32_t lzma_vli_size(lzma_vli)");
}

Assistant:

extern LZMA_API(uint32_t)
lzma_vli_size(lzma_vli vli)
{
	if (vli > LZMA_VLI_MAX)
		return 0;

	uint32_t i = 0;
	do {
		vli >>= 7;
		++i;
	} while (vli != 0);

	assert(i <= LZMA_VLI_BYTES_MAX);
	return i;
}